

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O0

char * strtoken(char *src,char *dst,int size)

{
  char *__src;
  int local_44;
  char *pcStack_40;
  int len;
  char *ed;
  char *st;
  char *p;
  int size_local;
  char *dst_local;
  char *src_local;
  
  st = src;
  while( true ) {
    __src = st;
    if ((*st == '\n') || (*st == '\0')) {
      return (char *)0x0;
    }
    if ((*st != ' ') && (*st != '\t')) break;
    st = st + 1;
  }
  for (; pcStack_40 = st, *st != ' '; st = st + 1) {
    if ((*st == '\n') || (*st == '\0')) goto LAB_0010f7d3;
  }
  st = st + 1;
LAB_0010f7d3:
  do {
    pcStack_40 = pcStack_40 + -1;
    if (__src == pcStack_40) break;
  } while ((*pcStack_40 == ' ') || (*pcStack_40 == '\t'));
  local_44 = ((int)pcStack_40 - (int)__src) + 1;
  if ((0 < size) && (size <= local_44)) {
    local_44 = size + -1;
  }
  strncpy(dst,__src,(long)local_44);
  dst[local_44] = '\0';
  return st;
}

Assistant:

char *strtoken(char *src, char *dst, int size)
{
    char *p, *st, *ed;
    int  len = 0;

    // l-trim
    p = src;

    while(TRUE)
    {
        if((*p == '\n') || (*p == 0)) return NULL; /* value is not exists */
        if((*p != ' ') && (*p != '\t')) break;
        p++;
    }

    st = p;
    while(TRUE)
    {
        ed = p;
        if(*p == ' ') {
            p++;
            break;
        }
        if((*p == '\n') || (*p == 0)) break;
        p++;
    }

    // r-trim
    while(TRUE)
    {
        ed--;
        if(st == ed) break;
        if((*ed != ' ') && (*ed != '\t')) break;
    }

    len = (int)(ed - st + 1);
    if((size > 0) && (len >= size)) len = size - 1;

    strncpy(dst, st, len);
    dst[len]=0;

    return p;
}